

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_object.c
# Opt level: O2

void assert_print_object(char *expected,char *input)

{
  long lVar1;
  cJSON_bool cVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  parse_buffer local_920;
  printbuffer local_8e8;
  printbuffer local_8a8;
  cJSON item [1];
  uchar printed_formatted [1024];
  uchar printed_unformatted [1024];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_8a8.depth = 0;
  local_8a8.noalloc = 0;
  local_8a8.format = 0;
  local_8e8.depth = 0;
  local_8e8.noalloc = 0;
  local_8e8.format = 0;
  local_920.offset = 0;
  local_920.depth = 0;
  local_920.content = (uchar *)input;
  sVar3 = strlen(input);
  local_920.length = sVar3 + 1;
  local_920.hooks.allocate = global_hooks.allocate;
  local_920.hooks.deallocate = global_hooks.deallocate;
  local_8a8.buffer = printed_formatted;
  local_8a8.length = 0x400;
  local_8a8.offset = 0;
  local_920.hooks.reallocate = global_hooks.reallocate;
  local_8a8.noalloc = 1;
  local_8a8.hooks.allocate = global_hooks.allocate;
  local_8a8.hooks.deallocate = global_hooks.deallocate;
  local_8a8.hooks.reallocate = global_hooks.reallocate;
  local_8e8.buffer = printed_unformatted;
  local_8e8.length = 0x400;
  local_8e8.offset = 0;
  local_8e8.noalloc = 1;
  local_8e8.hooks.allocate = global_hooks.allocate;
  local_8e8.hooks.deallocate = global_hooks.deallocate;
  local_8e8.hooks.reallocate = global_hooks.reallocate;
  item[0].valuedouble = 0.0;
  item[0].string = (char *)0x0;
  item[0].valuestring = (char *)0x0;
  item[0].valueint = 0;
  item[0]._44_4_ = 0;
  item[0].child = (cJSON *)0x0;
  item[0].type = 0;
  item[0]._28_4_ = 0;
  item[0].next = (cJSON *)0x0;
  item[0].prev = (cJSON *)0x0;
  cVar2 = parse_object(item,&local_920);
  if (cVar2 == 0) {
    UnityFail("Failed to parse object.",0x3a);
  }
  local_8e8._32_8_ = local_8e8._32_8_ & 0xffffffff;
  cVar2 = print_object(item,&local_8e8);
  if (cVar2 == 0) {
    UnityFail("Failed to print unformatted string.",0x3d);
  }
  UnityAssertEqualString
            (input,(char *)printed_unformatted,"Unformatted object is not correct.",0x3e);
  local_8a8.format = 1;
  cVar2 = print_object(item,&local_8a8);
  if (cVar2 == 0) {
    UnityFail("Failed to print formatted string.",0x41);
  }
  UnityAssertEqualString(expected,(char *)printed_formatted,"Formatted object is not correct.",0x42)
  ;
  reset(item);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void assert_print_object(const char * const expected, const char * const input)
{
    unsigned char printed_unformatted[1024];
    unsigned char printed_formatted[1024];

    cJSON item[1];

    printbuffer formatted_buffer = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };
    printbuffer unformatted_buffer = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };
    parse_buffer parsebuffer = { 0, 0, 0, 0, { 0, 0, 0 } };

    /* buffer for parsing */
    parsebuffer.content = (const unsigned char*)input;
    parsebuffer.length = strlen(input) + sizeof("");
    parsebuffer.hooks = global_hooks;

    /* buffer for formatted printing */
    formatted_buffer.buffer = printed_formatted;
    formatted_buffer.length = sizeof(printed_formatted);
    formatted_buffer.offset = 0;
    formatted_buffer.noalloc = true;
    formatted_buffer.hooks = global_hooks;

    /* buffer for unformatted printing */
    unformatted_buffer.buffer = printed_unformatted;
    unformatted_buffer.length = sizeof(printed_unformatted);
    unformatted_buffer.offset = 0;
    unformatted_buffer.noalloc = true;
    unformatted_buffer.hooks = global_hooks;

    memset(item, 0, sizeof(item));
    TEST_ASSERT_TRUE_MESSAGE(parse_object(item, &parsebuffer), "Failed to parse object.");

    unformatted_buffer.format = false;
    TEST_ASSERT_TRUE_MESSAGE(print_object(item, &unformatted_buffer), "Failed to print unformatted string.");
    TEST_ASSERT_EQUAL_STRING_MESSAGE(input, printed_unformatted, "Unformatted object is not correct.");

    formatted_buffer.format = true;
    TEST_ASSERT_TRUE_MESSAGE(print_object(item, &formatted_buffer), "Failed to print formatted string.");
    TEST_ASSERT_EQUAL_STRING_MESSAGE(expected, printed_formatted, "Formatted object is not correct.");

    reset(item);
}